

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::anon_unknown_15::XmlReporter::test_run_start(XmlReporter *this)

{
  XmlWriter *this_00;
  ContextOptions *pCVar1;
  char *__s;
  String *pSVar2;
  string binary_name;
  allocator<char> local_182;
  allocator<char> local_181;
  allocator<char> local_180;
  allocator<char> local_17f;
  allocator<char> local_17e;
  allocator<char> local_17d;
  allocator<char> local_17c;
  allocator<char> local_17b;
  allocator<char> local_17a;
  allocator<char> local_179;
  undefined1 local_178 [8];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  this_00 = &this->xml;
  XmlWriter::writeDeclaration(this_00);
  pCVar1 = this->opt;
  if ((pCVar1->binary_name).field_0.buf[0x17] < '\0') {
    pSVar2 = (String *)(pCVar1->binary_name).field_0.data.ptr;
  }
  else {
    pSVar2 = &pCVar1->binary_name;
  }
  __s = skipPathFromFilename((char *)pSVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,__s,(allocator<char> *)(local_178 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_178 + 8),"doctest",(allocator<char> *)&local_110);
  XmlWriter::startElement(this_00,(string *)(local_178 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"binary",(allocator<char> *)&local_130);
  XmlWriter::writeAttribute(this_00,&local_150,&local_30);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)(local_178 + 8));
  if (this->opt->no_version == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_178 + 8),"version",(allocator<char> *)&local_150);
    XmlWriter::writeAttribute(this_00,(string *)(local_178 + 8),"2.4.9");
    std::__cxx11::string::~string((string *)(local_178 + 8));
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_178 + 8),"Options",&local_179)
  ;
  XmlWriter::scopedElement((XmlWriter *)local_178,(string *)this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"order_by",&local_17a);
  pCVar1 = this->opt;
  if ((pCVar1->order_by).field_0.buf[0x17] < '\0') {
    pSVar2 = (String *)(pCVar1->order_by).field_0.data.ptr;
  }
  else {
    pSVar2 = &pCVar1->order_by;
  }
  XmlWriter::writeAttribute((XmlWriter *)local_178,&local_150,(char *)pSVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"rand_seed",&local_17b);
  XmlWriter::writeAttribute<unsigned_int>((XmlWriter *)local_178,&local_110,&this->opt->rand_seed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"first",&local_17c);
  XmlWriter::writeAttribute<unsigned_int>((XmlWriter *)local_178,&local_130,&this->opt->first);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"last",&local_17d);
  XmlWriter::writeAttribute<unsigned_int>((XmlWriter *)local_178,&local_50,&this->opt->last);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"abort_after",&local_17e);
  XmlWriter::writeAttribute<int>((XmlWriter *)local_178,&local_70,&this->opt->abort_after);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"subcase_filter_levels",&local_17f);
  XmlWriter::writeAttribute<int>((XmlWriter *)local_178,&local_90,&this->opt->subcase_filter_levels)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"case_sensitive",&local_180);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)local_178,&local_b0,&this->opt->case_sensitive);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"no_throw",&local_181);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)local_178,&local_d0,&this->opt->no_throw);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"no_skip",&local_182);
  XmlWriter::ScopedElement::writeAttribute<bool>
            ((ScopedElement *)local_178,&local_f0,&this->opt->no_skip);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_150);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_178);
  std::__cxx11::string::~string((string *)(local_178 + 8));
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void test_run_start() override {
            xml.writeDeclaration();

            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS

            xml.startElement("doctest").writeAttribute("binary", binary_name);
            if(opt.no_version == false)
                xml.writeAttribute("version", DOCTEST_VERSION_STR);

            // only the consequential ones (TODO: filters)
            xml.scopedElement("Options")
                    .writeAttribute("order_by", opt.order_by.c_str())
                    .writeAttribute("rand_seed", opt.rand_seed)
                    .writeAttribute("first", opt.first)
                    .writeAttribute("last", opt.last)
                    .writeAttribute("abort_after", opt.abort_after)
                    .writeAttribute("subcase_filter_levels", opt.subcase_filter_levels)
                    .writeAttribute("case_sensitive", opt.case_sensitive)
                    .writeAttribute("no_throw", opt.no_throw)
                    .writeAttribute("no_skip", opt.no_skip);
        }